

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.cc
# Opt level: O2

void google::protobuf::compiler::java::ExtensionGenerator::InitTemplateVars
               (FieldDescriptor *descriptor,string *scope,bool immutable,
               ClassNameResolver *name_resolver,
               flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *vars_pointer,Context *context)

{
  bool bVar1;
  Type field_type;
  JavaType type;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char>,_std::__cxx11::basic_string<char>_>_>
  pbVar2;
  char *pcVar3;
  EnumDescriptor *descriptor_00;
  Descriptor *descriptor_01;
  int __c;
  undefined7 in_register_00000011;
  FieldDescriptor *field;
  AlphaNum *a;
  FieldDescriptor *field_00;
  AlphaNum *a_00;
  AlphaNum *pAVar4;
  ClassNameResolver *name_resolver_00;
  Context *options;
  string singular_type;
  allocator<char> local_155;
  undefined4 local_154;
  AlphaNum local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  AlphaNum local_100;
  AlphaNum local_d0;
  string local_a0;
  Options local_80;
  
  name_resolver_00 = (ClassNameResolver *)vars_pointer;
  options = context;
  pbVar2 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[6],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)vars_pointer,(key_arg<char[6]> *)0x58805c);
  std::__cxx11::string::_M_assign((string *)pbVar2);
  UnderscoresToCamelCaseCheckReserved_abi_cxx11_((string *)&local_150,(java *)descriptor,field);
  pbVar2 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[5],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)vars_pointer,(key_arg<char[5]> *)0x651c1c);
  std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  local_154 = (undefined4)CONCAT71(in_register_00000011,immutable);
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)&local_150,name_resolver,descriptor->containing_type_,immutable);
  pbVar2 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[16],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)vars_pointer,(key_arg<char[16]> *)"containing_type");
  std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_150,descriptor->number_);
  absl::lts_20250127::StrCat_abi_cxx11_((string *)&local_100,(lts_20250127 *)&local_150,a);
  pbVar2 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[7],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)vars_pointer,(key_arg<char[7]> *)0x619666);
  std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  FieldConstantName_abi_cxx11_((string *)&local_150,(java *)descriptor,field_00);
  pbVar2 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[14],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)vars_pointer,(key_arg<char[14]> *)0x4efc3f);
  pAVar4 = &local_150;
  std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  pcVar3 = FieldDescriptor::index(descriptor,(char *)pAVar4,__c);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_150,(int)pcVar3);
  absl::lts_20250127::StrCat_abi_cxx11_((string *)&local_100,(lts_20250127 *)&local_150,a_00);
  pbVar2 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[6],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)vars_pointer,(key_arg<char[6]> *)0x41e1cd);
  std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  bVar1 = FieldDescriptor::is_repeated(descriptor);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"",&local_155);
  }
  else {
    Options::Options(&local_80,&context->options_);
    name_resolver_00 = (ClassNameResolver *)&local_80;
    DefaultValue_abi_cxx11_
              ((string *)&local_150,(java *)descriptor,(FieldDescriptor *)(ulong)immutable,
               SUB81(name_resolver,0),name_resolver_00,(Options *)options);
  }
  pbVar2 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[8],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)vars_pointer,(key_arg<char[8]> *)0x57657a);
  std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  if (!bVar1) {
    Options::~Options(&local_80);
  }
  field_type = GetType(descriptor);
  local_100.piece_ = FieldTypeName(field_type);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_150,&local_100.piece_,(allocator<char> *)&local_d0);
  pbVar2 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[14],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)vars_pointer,(key_arg<char[14]> *)"type_constant");
  std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  FieldDescriptor::is_packed(descriptor);
  pbVar2 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[7],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)vars_pointer,(key_arg<char[7]> *)0x603e19);
  std::__cxx11::string::assign((char *)pbVar2);
  pbVar2 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[9],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)vars_pointer,(key_arg<char[9]> *)"enum_map");
  std::__cxx11::string::assign((char *)pbVar2);
  pbVar2 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[10],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)vars_pointer,(key_arg<char[10]> *)"prototype");
  std::__cxx11::string::assign((char *)pbVar2);
  type = GetJavaType(descriptor);
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  local_120._M_string_length = 0;
  local_120.field_2._M_local_buf[0] = '\0';
  switch(type) {
  case JAVATYPE_STRING:
    break;
  case JAVATYPE_BYTES:
    break;
  case JAVATYPE_ENUM:
    descriptor_00 = FieldDescriptor::enum_type(descriptor);
    ClassNameResolver::GetClassName_abi_cxx11_
              ((string *)&local_150,name_resolver,descriptor_00,immutable);
    std::__cxx11::string::operator=((string *)&local_120,(string *)&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    local_150.piece_._M_str = local_120._M_dataplus._M_p;
    local_150.piece_._M_len = local_120._M_string_length;
    local_100.piece_ = absl::lts_20250127::NullSafeStringView(".internalGetValueMap()");
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_d0,(lts_20250127 *)&local_150,&local_100,&local_100);
    pbVar2 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[9],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)vars_pointer,(key_arg<char[9]> *)"enum_map");
    goto LAB_002852c8;
  case JAVATYPE_MESSAGE:
    descriptor_01 = FieldDescriptor::message_type(descriptor);
    ClassNameResolver::GetClassName_abi_cxx11_
              ((string *)&local_150,name_resolver,descriptor_01,immutable);
    std::__cxx11::string::operator=((string *)&local_120,(string *)&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    local_150.piece_._M_str = local_120._M_dataplus._M_p;
    local_150.piece_._M_len = local_120._M_string_length;
    local_100.piece_ = absl::lts_20250127::NullSafeStringView(".getDefaultInstance()");
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_d0,(lts_20250127 *)&local_150,&local_100,&local_100);
    pbVar2 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[10],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)vars_pointer,(key_arg<char[10]> *)"prototype");
LAB_002852c8:
    pAVar4 = &local_d0;
LAB_00285325:
    std::__cxx11::string::operator=((string *)pbVar2,(string *)pAVar4);
    std::__cxx11::string::~string((string *)pAVar4);
    goto LAB_00285335;
  default:
    local_100.piece_ = BoxedPrimitiveTypeName(type);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_150,&local_100.piece_,(allocator<char> *)&local_d0);
    pbVar2 = &local_120;
    pAVar4 = &local_150;
    goto LAB_00285325;
  }
  std::__cxx11::string::assign((char *)&local_120);
LAB_00285335:
  bVar1 = FieldDescriptor::is_repeated(descriptor);
  if (bVar1) {
    local_150.piece_ = absl::lts_20250127::NullSafeStringView("java.util.List<");
    local_100.piece_._M_str = local_120._M_dataplus._M_p;
    local_100.piece_._M_len = local_120._M_string_length;
    local_d0.piece_ = absl::lts_20250127::NullSafeStringView(">");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_a0,(lts_20250127 *)&local_150,&local_100,&local_d0,
               (AlphaNum *)name_resolver_00);
  }
  else {
    std::__cxx11::string::string((string *)&local_a0,(string *)&local_120);
  }
  pbVar2 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[5],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)vars_pointer,(key_arg<char[5]> *)0x61655a);
  std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  pbVar2 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[14],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)vars_pointer,(key_arg<char[14]> *)"singular_type");
  std::__cxx11::string::_M_assign((string *)pbVar2);
  std::__cxx11::string::~string((string *)&local_120);
  return;
}

Assistant:

void ExtensionGenerator::InitTemplateVars(
    const FieldDescriptor* descriptor, const std::string& scope, bool immutable,
    ClassNameResolver* name_resolver,
    absl::flat_hash_map<absl::string_view, std::string>* vars_pointer,
    Context* context) {
  absl::flat_hash_map<absl::string_view, std::string>& vars = *vars_pointer;
  vars["scope"] = scope;
  vars["name"] = UnderscoresToCamelCaseCheckReserved(descriptor);
  vars["containing_type"] =
      name_resolver->GetClassName(descriptor->containing_type(), immutable);
  vars["number"] = absl::StrCat(descriptor->number());
  vars["constant_name"] = FieldConstantName(descriptor);
  vars["index"] = absl::StrCat(descriptor->index());
  vars["default"] = descriptor->is_repeated()
                        ? ""
                        : DefaultValue(descriptor, immutable, name_resolver,
                                       context->options());
  vars["type_constant"] = std::string(FieldTypeName(GetType(descriptor)));
  vars["packed"] = descriptor->is_packed() ? "true" : "false";
  vars["enum_map"] = "null";
  vars["prototype"] = "null";

  JavaType java_type = GetJavaType(descriptor);
  std::string singular_type;
  switch (java_type) {
    case JAVATYPE_MESSAGE:
      singular_type =
          name_resolver->GetClassName(descriptor->message_type(), immutable);
      vars["prototype"] = absl::StrCat(singular_type, ".getDefaultInstance()");
      break;
    case JAVATYPE_ENUM:
      singular_type =
          name_resolver->GetClassName(descriptor->enum_type(), immutable);
      vars["enum_map"] = absl::StrCat(singular_type, ".internalGetValueMap()");
      break;
    case JAVATYPE_STRING:
      singular_type = "java.lang.String";
      break;
    case JAVATYPE_BYTES:
      singular_type = immutable ? "com.google.protobuf.ByteString" : "byte[]";
      break;
    default:
      singular_type = std::string(BoxedPrimitiveTypeName(java_type));
      break;
  }
  vars["type"] = descriptor->is_repeated()
                     ? absl::StrCat("java.util.List<", singular_type, ">")
                     : singular_type;
  vars["singular_type"] = singular_type;
}